

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructOrUnionDeclaration_Struct.cpp
# Opt level: O0

ostream * psy::C::operator<<(ostream *os,StructDeclarationSymbol *strukt)

{
  ScopeKind K;
  bool bVar1;
  ostream *poVar2;
  TagType *tagTy;
  Scope *this;
  reference ppFVar3;
  FieldDeclarationSymbol **fld;
  iterator __end2;
  iterator __begin2;
  Fields *__range2;
  StructDeclarationSymbol *strukt_local;
  ostream *os_local;
  
  if (strukt == (StructDeclarationSymbol *)0x0) {
    os_local = std::operator<<(os,"<Struct is null>");
  }
  else {
    std::operator<<(os,"<Struct |");
    poVar2 = std::operator<<(os," type:");
    tagTy = TagDeclarationSymbol::introducedNewType((TagDeclarationSymbol *)strukt);
    operator<<(poVar2,tagTy);
    poVar2 = std::operator<<(os," scope:");
    this = DeclarationSymbol::enclosingScope((DeclarationSymbol *)strukt);
    K = Scope::kind(this);
    operator<<(poVar2,K);
    StructOrUnionDeclarationSymbol::fields
              ((Fields *)&__begin2,&strukt->super_StructOrUnionDeclarationSymbol);
    __end2 = std::
             vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
             ::begin((vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                      *)&__begin2);
    fld = (FieldDeclarationSymbol **)
          std::
          vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
          ::end((vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                 *)&__begin2);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_psy::C::FieldDeclarationSymbol_**,_std::vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>_>
                                  *)&fld);
      if (!bVar1) break;
      ppFVar3 = __gnu_cxx::
                __normal_iterator<const_psy::C::FieldDeclarationSymbol_**,_std::vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>_>
                ::operator*(&__end2);
      poVar2 = std::operator<<(os," field:");
      operator<<(poVar2,*ppFVar3);
      __gnu_cxx::
      __normal_iterator<const_psy::C::FieldDeclarationSymbol_**,_std::vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
    ::~vector((vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
               *)&__begin2);
    std::operator<<(os,">");
    os_local = os;
  }
  return os_local;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const StructDeclarationSymbol* strukt)
{
    if (!strukt)
        return os << "<Struct is null>";
    os << "<Struct |";
    os << " type:" << strukt->introducedNewType();
    os << " scope:" << strukt->enclosingScope()->kind();
    for (const auto& fld : strukt->fields())
        os << " field:" << fld;
    os << ">";
    return os;
}